

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O2

boolean undiscovered_artifact(xchar m)

{
  char *pcVar1;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 0x24) {
      return '\x01';
    }
    pcVar1 = artidisco + lVar2;
    if (*pcVar1 == m) break;
    lVar2 = lVar2 + 1;
    if (*pcVar1 == '\0') {
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

boolean undiscovered_artifact(xchar m)
{
    int i;

    /* look for this artifact in the discoveries list;
       if we hit an empty slot then it's undiscovered */
    for (i = 0; i < NROFARTIFACTS; i++)
	if (artidisco[i] == m)
	    return FALSE;
	else if (artidisco[i] == 0)
	    break;
    return TRUE;
}